

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

bool __thiscall OrPattern::alwaysFalse(OrPattern *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  int iVar3;
  pointer ppDVar4;
  
  ppDVar2 = (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppDVar4 = ppDVar2;
    ppDVar1 = (this->orlist).
              super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppDVar4 == ppDVar1) break;
    iVar3 = (*((*ppDVar4)->super_Pattern)._vptr_Pattern[0xb])();
    ppDVar2 = ppDVar4 + 1;
  } while ((char)iVar3 != '\0');
  return ppDVar4 == ppDVar1;
}

Assistant:

bool OrPattern::alwaysFalse(void) const

{
  vector<DisjointPattern *>::const_iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    if (!(*iter)->alwaysFalse()) return false;
  return true;
}